

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void AnalyzeFunctionArgumentsEarly
               (ExpressionContext *ctx,SynCallArgument *argumentHead,
               SmallArray<ArgumentData,_16U> *resultArguments)

{
  undefined8 *puVar1;
  uint uVar2;
  SynBase *syntax;
  ArgumentData *pAVar3;
  SynIdentifier *pSVar4;
  TypeBase *pTVar5;
  ExprBase *pEVar6;
  uint7 uStack_57;
  
  if (argumentHead != (SynCallArgument *)0x0) {
    do {
      syntax = argumentHead->value;
      if ((syntax == (SynBase *)0x0) || (syntax->typeID != 0x39)) {
        pEVar6 = AnalyzeExpression(ctx,syntax);
        pSVar4 = argumentHead->name;
        pTVar5 = pEVar6->type;
        if (resultArguments->count == resultArguments->max) {
          SmallArray<ArgumentData,_16U>::grow(resultArguments,resultArguments->count);
        }
        pAVar3 = resultArguments->data;
        if (pAVar3 == (ArgumentData *)0x0) goto LAB_00173393;
        uVar2 = resultArguments->count;
        resultArguments->count = uVar2 + 1;
        pAVar3[uVar2].source = &argumentHead->super_SynBase;
        pAVar3[uVar2].isExplicit = false;
        pAVar3[uVar2].name = pSVar4;
        pAVar3[uVar2].type = pTVar5;
        pAVar3[uVar2].value = pEVar6;
        pAVar3[uVar2].valueFunction = (FunctionData *)0x0;
      }
      else {
        if (resultArguments->count == resultArguments->max) {
          SmallArray<ArgumentData,_16U>::grow(resultArguments,resultArguments->count);
        }
        pAVar3 = resultArguments->data;
        if (pAVar3 == (ArgumentData *)0x0) {
LAB_00173393:
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<ArgumentData, 16>::push_back(const T &) [T = ArgumentData, N = 16]"
                       );
        }
        uVar2 = resultArguments->count;
        resultArguments->count = uVar2 + 1;
        pAVar3[uVar2].source = (SynBase *)0x0;
        pAVar3[uVar2].isExplicit = false;
        *(ulong *)&pAVar3[uVar2].field_0x9 = (ulong)uStack_57;
        *(undefined8 *)(&pAVar3[uVar2].field_0x9 + 8) = 0;
        puVar1 = (undefined8 *)((long)&pAVar3[uVar2].type + 1);
        *puVar1 = 0;
        puVar1[1] = 0;
        pAVar3[uVar2].valueFunction = (FunctionData *)0x0;
      }
      argumentHead = (SynCallArgument *)(argumentHead->super_SynBase).next;
    } while ((argumentHead != (SynCallArgument *)0x0) &&
            ((argumentHead->super_SynBase).typeID == 0x18));
  }
  return;
}

Assistant:

void AnalyzeFunctionArgumentsEarly(ExpressionContext &ctx, SynCallArgument *argumentHead, SmallArray<ArgumentData, 16> &resultArguments)
{
	for(SynCallArgument *el = argumentHead; el; el = getType<SynCallArgument>(el->next))
	{
		if(isType<SynShortFunctionDefinition>(el->value))
		{
			resultArguments.push_back(ArgumentData());
		}
		else
		{
			ExprBase *argument = AnalyzeExpression(ctx, el->value);

			resultArguments.push_back(ArgumentData(el, false, el->name, argument->type, argument));
		}
	}
}